

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O0

long oggpackB_read1(oggpack_buffer *b)

{
  long ret;
  oggpack_buffer *b_local;
  
  if (b->endbyte < b->storage) {
    b_local = (oggpack_buffer *)(long)(int)((int)(uint)*b->ptr >> (7U - (char)b->endbit & 0x1f) & 1)
    ;
    b->endbit = b->endbit + 1;
    if (7 < b->endbit) {
      b->endbit = 0;
      b->ptr = b->ptr + 1;
      b->endbyte = b->endbyte + 1;
    }
  }
  else {
    b->ptr = (uchar *)0x0;
    b->endbyte = b->storage;
    b->endbit = 1;
    b_local = (oggpack_buffer *)0xffffffffffffffff;
  }
  return (long)b_local;
}

Assistant:

long oggpackB_read1(oggpack_buffer *b){
  long ret;

  if(b->endbyte >= b->storage) goto overflow;
  ret=(b->ptr[0]>>(7-b->endbit))&1;

  b->endbit++;
  if(b->endbit>7){
    b->endbit=0;
    b->ptr++;
    b->endbyte++;
  }
  return ret;

 overflow:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
  return -1L;
}